

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O0

char * Diligent::GetInputElementFrequencyString(INPUT_ELEMENT_FREQUENCY Frequency)

{
  Char *Message;
  undefined1 local_38 [8];
  string msg;
  char *pcStack_10;
  INPUT_ELEMENT_FREQUENCY Frequency_local;
  
  if (Frequency == INPUT_ELEMENT_FREQUENCY_UNDEFINED) {
    pcStack_10 = "undefined";
  }
  else if (Frequency == INPUT_ELEMENT_FREQUENCY_PER_VERTEX) {
    pcStack_10 = "per-vertex";
  }
  else if (Frequency == INPUT_ELEMENT_FREQUENCY_PER_INSTANCE) {
    pcStack_10 = "per-instance";
  }
  else {
    msg.field_2._M_local_buf[0xf] = Frequency;
    FormatString<char[44]>
              ((string *)local_38,(char (*) [44])"Unknown/unsupported input element frequency");
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"GetInputElementFrequencyString",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
               ,0x6f8);
    std::__cxx11::string::~string((string *)local_38);
    pcStack_10 = "UNKNOWN";
  }
  return pcStack_10;
}

Assistant:

const char* GetInputElementFrequencyString(INPUT_ELEMENT_FREQUENCY Frequency)
{
    switch (Frequency)
    {
        case INPUT_ELEMENT_FREQUENCY_UNDEFINED: return "undefined";
        case INPUT_ELEMENT_FREQUENCY_PER_VERTEX: return "per-vertex";
        case INPUT_ELEMENT_FREQUENCY_PER_INSTANCE: return "per-instance";

        default:
            UNEXPECTED("Unknown/unsupported input element frequency");
            return "UNKNOWN";
    }
}